

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O0

QString * __thiscall
QTimeZonePrivate::displayName
          (QTimeZonePrivate *this,qint64 atMSecsSinceEpoch,NameType nameType,QLocale *locale)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  qint64 qVar4;
  int in_ECX;
  qint64 in_RDX;
  QTimeZonePrivate *in_RSI;
  QString *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  TimeType timeType;
  QLocale *in_stack_00000050;
  Data tran;
  QString *in_stack_ffffffffffffff48;
  QString *in_stack_ffffffffffffff50;
  TimeType in_stack_ffffffffffffffa8;
  QTimeZonePrivate *this_00;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaa;
  uStack_14 = 0xaaaaaaaa;
  uStack_10 = 0xaaaaaaaa;
  uStack_c = 0xaaaaaaaa;
  local_28 = 0xaaaaaaaa;
  uStack_24 = 0xaaaaaaaa;
  uStack_20 = 0xaaaaaaaa;
  uStack_1c = 0xaaaaaaaa;
  local_38 = 0xaaaaaaaa;
  uStack_34 = 0xaaaaaaaa;
  uStack_30 = 0xaaaaaaaa;
  uStack_2c = 0xaaaaaaaa;
  this_00 = in_RSI;
  (*in_RSI->_vptr_QTimeZonePrivate[0xd])(&local_38,in_RSI,in_RDX);
  lVar1 = CONCAT44(uStack_1c,uStack_20);
  qVar4 = invalidMSecs();
  if (lVar1 == qVar4) {
    QString::QString((QString *)0x737f55);
  }
  else if ((in_ECX == 3) && (bVar2 = isAnglicLocale((QLocale *)in_stack_ffffffffffffff50), bVar2)) {
    isoOffsetFormat((int)((ulong)qVar4 >> 0x20),(NameType)qVar4);
  }
  else if ((in_ECX == 2) &&
          (uVar3 = (*in_RSI->_vptr_QTimeZonePrivate[0xf])(in_RSI,in_R8), (uVar3 & 1) != 0)) {
    QString::QString(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  else {
    localeName(this_00,in_RDX,in_ECX,in_stack_ffffffffffffffa8,(NameType)((ulong)in_R8 >> 0x20),
               in_stack_00000050);
  }
  Data::~Data((Data *)0x737f6a);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QTimeZonePrivate::displayName(qint64 atMSecsSinceEpoch,
                                      QTimeZone::NameType nameType,
                                      const QLocale &locale) const
{
    const Data tran = data(atMSecsSinceEpoch);
    if (tran.atMSecsSinceEpoch != invalidMSecs()) {
        if (nameType == QTimeZone::OffsetName && isAnglicLocale(locale))
            return isoOffsetFormat(tran.offsetFromUtc);
        if (nameType == QTimeZone::ShortName && isDataLocale(locale))
            return tran.abbreviation;

        QTimeZone::TimeType timeType
            = tran.daylightTimeOffset != 0 ? QTimeZone::DaylightTime : QTimeZone::StandardTime;
#if QT_CONFIG(timezone_locale)
        return localeName(atMSecsSinceEpoch, tran.offsetFromUtc, timeType, nameType, locale);
#else
        return displayName(timeType, nameType, locale);
#endif
    }
    return QString();
}